

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecompressZip
               (uchar *dst,unsigned_long *uncompressed_size,uchar *src,unsigned_long src_size)

{
  size_t sVar1;
  int iVar2;
  allocator_type *paVar3;
  reference pvVar4;
  size_t in_RCX;
  void *in_RDX;
  value_type *pvVar5;
  size_t *in_RSI;
  value_type *in_RDI;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  int in_stack_00000f24;
  char *in_stack_00000f28;
  int in_stack_00000f34;
  char *in_stack_00000f38;
  size_type in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  value_type *local_90;
  reference local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  allocator_type *local_68;
  bool local_1;
  
  if (*in_RSI == in_RCX) {
    memcpy(in_RDI,in_RDX,in_RCX);
    local_1 = true;
  }
  else {
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4524f8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_ffffffffffffff50,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x45251e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    iVar2 = stbi_zlib_decode_buffer
                      (in_stack_00000f38,in_stack_00000f34,in_stack_00000f28,in_stack_00000f24);
    if (iVar2 < 0) {
      local_1 = false;
    }
    else {
      paVar3 = (allocator_type *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff40 = paVar3;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      sVar1 = *in_RSI;
      while (local_68 = paVar3 + 1, local_68 < (allocator_type *)(pvVar4 + sVar1)) {
        *local_68 = (allocator_type)((char)*paVar3 + (char)*local_68 + 0x80);
        paVar3 = local_68;
      }
      local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (local_80,in_stack_ffffffffffffff28);
      sVar1 = *in_RSI;
      local_90 = in_RDI;
      local_88 = pvVar4 + (*in_RSI + 1 >> 1);
      while (local_90 < in_RDI + sVar1) {
        pvVar5 = local_90 + 1;
        *local_90 = *(value_type *)
                     &(local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
        if (in_RDI + sVar1 <= pvVar5) break;
        local_90 = local_90 + 2;
        *pvVar5 = *local_88;
        local_88 = local_88 + 1;
        local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(local_80->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_1 = true;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40);
  }
  return local_1;
}

Assistant:

static bool DecompressZip(unsigned char *dst,
                          unsigned long *uncompressed_size /* inout */,
                          const unsigned char *src, unsigned long src_size) {
  if ((*uncompressed_size) == src_size) {
    // Data is not compressed(Issue 40).
    memcpy(dst, src, src_size);
    return true;
  }
  std::vector<unsigned char> tmpBuf(*uncompressed_size);

#if TINYEXR_USE_MINIZ
  int ret =
      mz_uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (MZ_OK != ret) {
    return false;
  }
#elif TINYEXR_USE_STB_ZLIB
  int ret = stbi_zlib_decode_buffer(reinterpret_cast<char*>(&tmpBuf.at(0)),
      *uncompressed_size, reinterpret_cast<const char*>(src), src_size);
  if (ret < 0) {
    return false;
  }
#else
  int ret = uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (Z_OK != ret) {
    return false;
  }
#endif

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + (*uncompressed_size);

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (*uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + (*uncompressed_size);

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }

  return true;
}